

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void calc_rate_dist_block_param
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int calculate_rd,int *early_term,
               BLOCK_SIZE bsize,uint sse)

{
  undefined4 in_register_0000000c;
  int *unaff_RBX;
  MACROBLOCK *x_00;
  undefined7 in_register_00000089;
  int64_t *unaff_R14;
  
  if ((int)rd_stats != 0) {
    if (*(int *)CONCAT44(in_register_0000000c,calculate_rd) == 0) {
      x_00 = (MACROBLOCK *)((ulong)early_term & 0xff);
      model_rd_with_curvfit
                (cpi,x_00,(BLOCK_SIZE)x->plane[0].coeff,
                 (uint)(byte)x_00[0x1d].search_site_cfg_buf[6].site[0x10][1].offset *
                 (uint)(byte)x_00[0x1d].search_site_cfg_buf[6].site[0x10][5].offset,(int64_t)x,
                 (int)x + 8,unaff_RBX,unaff_R14);
      if (*(int *)CONCAT44(in_register_0000000c,calculate_rd) == 0) {
        return;
      }
    }
    *(undefined4 *)&x->plane[0].src_diff = 0;
    x->plane[0].dqcoeff =
         (tran_low_t *)(ulong)(uint)((int)CONCAT71(in_register_00000089,bsize) << 4);
  }
  return;
}

Assistant:

static inline void calc_rate_dist_block_param(AV1_COMP *cpi, MACROBLOCK *x,
                                              RD_STATS *rd_stats,
                                              int calculate_rd, int *early_term,
                                              BLOCK_SIZE bsize,
                                              unsigned int sse) {
  if (calculate_rd) {
    if (!*early_term) {
      const int bw = block_size_wide[bsize];
      const int bh = block_size_high[bsize];

      model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, rd_stats->sse, bw * bh,
                            &rd_stats->rate, &rd_stats->dist);
    }

    if (*early_term) {
      rd_stats->rate = 0;
      rd_stats->dist = sse << 4;
    }
  }
}